

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_short>,unsigned_short,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ushort uVar1;
  ushort *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar5 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar3 = *(long *)(input + 0x28);
      uVar8 = 0;
      uVar12 = 0;
      do {
        if (lVar3 == 0) {
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
LAB_004abc30:
          uVar10 = uVar12;
          if (uVar12 < uVar9) {
            bVar6 = *state;
            uVar7 = *(ushort *)(state + 2);
            do {
              uVar1 = *(ushort *)(lVar5 + uVar12 * 2);
              if ((bVar6 & 1) == 0) {
                *state = '\x01';
                bVar6 = 1;
                uVar7 = uVar1;
              }
              else {
                uVar7 = uVar1 ^ uVar7;
              }
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
            *(ushort *)(state + 2) = uVar7;
            uVar10 = uVar9;
          }
        }
        else {
          uVar4 = *(ulong *)(lVar3 + uVar8 * 8);
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_004abc30;
          uVar10 = uVar9;
          if ((uVar4 != 0) && (uVar10 = uVar12, uVar12 < uVar9)) {
            uVar14 = 0;
            do {
              if ((uVar4 >> (uVar14 & 0x3f) & 1) != 0) {
                uVar7 = *(ushort *)(lVar5 + uVar12 * 2 + uVar14 * 2);
                if (*state == '\0') {
                  *(ushort *)(state + 2) = uVar7;
                  *state = '\x01';
                }
                else {
                  *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ uVar7;
                }
              }
              uVar14 = uVar14 + 1;
              uVar10 = uVar9;
            } while (uVar9 - uVar12 != uVar14);
          }
        }
        uVar8 = uVar8 + 1;
        uVar12 = uVar10;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      puVar2 = *(ushort **)(input + 0x20);
      bVar6 = *state;
      do {
        uVar7 = *puVar2;
        if ((bVar6 & 1) == 0) {
          *state = '\x01';
          bVar6 = 1;
        }
        else {
          uVar7 = uVar7 ^ *(ushort *)(state + 2);
        }
        *(ushort *)(state + 2) = uVar7;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar5 = *local_68;
        bVar6 = *state;
        uVar7 = *(ushort *)(state + 2);
        iVar11 = 0;
        do {
          iVar13 = iVar11;
          if (lVar5 != 0) {
            iVar13 = (idx_t)*(uint *)(lVar5 + iVar11 * 4);
          }
          uVar1 = *(ushort *)(local_60 + iVar13 * 2);
          if ((bVar6 & 1) == 0) {
            *state = '\x01';
            bVar6 = 1;
            uVar7 = uVar1;
          }
          else {
            uVar7 = uVar1 ^ uVar7;
          }
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
        *(ushort *)(state + 2) = uVar7;
      }
    }
    else if (count != 0) {
      lVar5 = *local_68;
      iVar11 = 0;
      do {
        iVar13 = iVar11;
        if (lVar5 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar5 + iVar11 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar13 >> 6) * 8) >> (iVar13 & 0x3f) & 1) != 0) {
          uVar7 = *(ushort *)(local_60 + iVar13 * 2);
          if (*state == '\0') {
            *(ushort *)(state + 2) = uVar7;
            *state = '\x01';
          }
          else {
            *(ushort *)(state + 2) = *(ushort *)(state + 2) ^ uVar7;
          }
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}